

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O1

Memory * __thiscall wabt::Module::GetMemory(Module *this,Var *var)

{
  pointer ppMVar1;
  Index IVar2;
  Memory *pMVar3;
  
  IVar2 = BindingHash::FindIndex(&this->memory_bindings,var);
  ppMVar1 = (this->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)IVar2 <
      (ulong)((long)(this->memories).
                    super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)ppMVar1 >> 3)) {
    pMVar3 = ppMVar1[IVar2];
  }
  else {
    pMVar3 = (Memory *)0x0;
  }
  return pMVar3;
}

Assistant:

const Memory* Module::GetMemory(const Var& var) const {
  return const_cast<Module*>(this)->GetMemory(var);
}